

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

void __thiscall JSONNode::cast(JSONNode *this,char newtype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internalJSONNode *piVar2;
  pointer pcVar3;
  bool val;
  size_t *psVar4;
  double val_00;
  JSONNode local_58;
  json_string local_50;
  
  piVar2 = this->internal;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar2 != (internalJSONNode *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_50.field_2._7_4_ = 0x6c616e72;
  local_50._M_string_length = 0xb;
  local_50.field_2._M_local_buf[0xb] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((int)newtype == (uint)this->internal->_type) {
    return;
  }
  switch((int)newtype) {
  case 0:
    nullify(this);
    break;
  case 1:
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    piVar2 = this->internal;
    internalJSONNode::Fetch(piVar2);
    pcVar3 = (piVar2->_string)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (piVar2->_string)._M_string_length);
    operator=(this,&local_50);
    goto LAB_001131d8;
  case 2:
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    val_00 = internalJSONNode::operator_cast_to_double(this->internal);
    operator=(this,val_00);
    break;
  case 3:
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    val = internalJSONNode::operator_cast_to_bool(this->internal);
    operator=(this,val);
    break;
  case 4:
    as_array(&local_58);
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (this->internal != local_58.internal) {
      decRef(this);
      (local_58.internal)->refcount = (local_58.internal)->refcount + 1;
      this->internal = (internalJSONNode *)local_58;
    }
    if (local_58.internal != (internalJSONNode *)0x0) {
      decRef(&local_58);
    }
    psVar4 = getDtorCounter();
    goto LAB_001131a8;
  case 5:
    as_node(&local_58);
    local_50.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_50.field_2._7_4_ = 0x6c616e72;
    local_50._M_string_length = 0xb;
    local_50.field_2._M_local_buf[0xb] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (this->internal != local_58.internal) {
      decRef(this);
      (local_58.internal)->refcount = (local_58.internal)->refcount + 1;
      this->internal = (internalJSONNode *)local_58;
    }
    if (local_58.internal != (internalJSONNode *)0x0) {
      decRef(&local_58);
    }
    psVar4 = getDtorCounter();
LAB_001131a8:
    *psVar4 = *psVar4 + 1;
    break;
  default:
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cast to unknown type","");
    JSONDebug::_JSON_FAIL(&local_50);
LAB_001131d8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void JSONNode::cast(char newtype) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (newtype == type()) return;

	   switch(newtype){
		  case JSON_NULL:
			 nullify();
			 return;
		  case JSON_STRING:
			 *this = as_string();
			 return;
		  case JSON_NUMBER:
			 *this = as_float();
			 return;
		  case JSON_BOOL:
			 *this = as_bool();
			 return;
		  case JSON_ARRAY:
			 *this = as_array();
			 return;
		  case JSON_NODE:
			 *this = as_node();
			 return;
	   }
	   JSON_FAIL(JSON_TEXT("cast to unknown type"));
    }